

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnection::onlineStateChanged(QHttpNetworkConnection *this,bool isOnline)

{
  long lVar1;
  int __fd;
  undefined7 in_register_00000031;
  long lVar2;
  int i;
  long lVar3;
  QHttpNetworkConnectionChannel *this_00;
  
  if ((int)CONCAT71(in_register_00000031,isOnline) != 0) {
    return;
  }
  lVar1 = *(long *)(this + 8);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(lVar1 + 0xa0); lVar3 = lVar3 + 1) {
    this_00 = (QHttpNetworkConnectionChannel *)(*(long *)(lVar1 + 0xb8) + lVar2);
    __fd = 7;
    QHttpNetworkConnectionChannel::emitFinishedWithError
              (this_00,TemporaryNetworkFailureError,"Temporary network failure.");
    QHttpNetworkConnectionChannel::close(this_00,__fd);
    lVar2 = lVar2 + 0x108;
  }
  QNetworkConnectionMonitor::stopMonitoring((QNetworkConnectionMonitor *)(lVar1 + 0x130));
  return;
}

Assistant:

void QHttpNetworkConnection::onlineStateChanged(bool isOnline)
{
    Q_D(QHttpNetworkConnection);

    if (isOnline) {
        // If we did not have any 'isOffline' previously - well, good
        // to know, we are 'online' apparently.
        return;
    }

    for (int i = 0; i < d->activeChannelCount; i++) {
        auto &channel = d->channels[i];
        channel.emitFinishedWithError(QNetworkReply::TemporaryNetworkFailureError, "Temporary network failure.");
        channel.close();
    }

    // We don't care, this connection is broken from our POV.
    d->connectionMonitor.stopMonitoring();
}